

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O0

void anon_unknown.dwarf_2bae81::CheckIMPORTED_GLOBAL(cmTarget *target,cmMakefile *context)

{
  bool bVar1;
  ostream *poVar2;
  string *psVar3;
  string local_1f0;
  ostringstream local_1c0 [8];
  ostringstream e;
  __normal_iterator<const_std::unique_ptr<cmTarget,_std::default_delete<cmTarget>_>_*,_std::vector<std::unique_ptr<cmTarget,_std::default_delete<cmTarget>_>,_std::allocator<std::unique_ptr<cmTarget,_std::default_delete<cmTarget>_>_>_>_>
  local_48;
  cmTarget **local_40;
  unique_ptr<cmTarget,_std::default_delete<cmTarget>_> *local_38;
  __normal_iterator<const_std::unique_ptr<cmTarget,_std::default_delete<cmTarget>_>_*,_std::vector<std::unique_ptr<cmTarget,_std::default_delete<cmTarget>_>,_std::allocator<std::unique_ptr<cmTarget,_std::default_delete<cmTarget>_>_>_>_>
  local_30;
  __normal_iterator<const_std::unique_ptr<cmTarget,_std::default_delete<cmTarget>_>_*,_std::vector<std::unique_ptr<cmTarget,_std::default_delete<cmTarget>_>,_std::allocator<std::unique_ptr<cmTarget,_std::default_delete<cmTarget>_>_>_>_>
  local_28;
  __normal_iterator<const_std::unique_ptr<cmTarget,_std::default_delete<cmTarget>_>_*,_std::vector<std::unique_ptr<cmTarget,_std::default_delete<cmTarget>_>,_std::allocator<std::unique_ptr<cmTarget,_std::default_delete<cmTarget>_>_>_>_>
  it;
  vector<std::unique_ptr<cmTarget,_std::default_delete<cmTarget>_>,_std::allocator<std::unique_ptr<cmTarget,_std::default_delete<cmTarget>_>_>_>
  *targets;
  cmMakefile *context_local;
  cmTarget *target_local;
  
  context_local = (cmMakefile *)target;
  it._M_current =
       (unique_ptr<cmTarget,_std::default_delete<cmTarget>_> *)
       cmMakefile::GetOwnedImportedTargets(context);
  local_30._M_current =
       (unique_ptr<cmTarget,_std::default_delete<cmTarget>_> *)
       std::
       vector<std::unique_ptr<cmTarget,_std::default_delete<cmTarget>_>,_std::allocator<std::unique_ptr<cmTarget,_std::default_delete<cmTarget>_>_>_>
       ::begin((vector<std::unique_ptr<cmTarget,_std::default_delete<cmTarget>_>,_std::allocator<std::unique_ptr<cmTarget,_std::default_delete<cmTarget>_>_>_>
                *)it._M_current);
  local_38 = (unique_ptr<cmTarget,_std::default_delete<cmTarget>_> *)
             std::
             vector<std::unique_ptr<cmTarget,_std::default_delete<cmTarget>_>,_std::allocator<std::unique_ptr<cmTarget,_std::default_delete<cmTarget>_>_>_>
             ::end((vector<std::unique_ptr<cmTarget,_std::default_delete<cmTarget>_>,_std::allocator<std::unique_ptr<cmTarget,_std::default_delete<cmTarget>_>_>_>
                    *)it._M_current);
  local_40 = (cmTarget **)&context_local;
  local_28 = std::
             find_if<__gnu_cxx::__normal_iterator<std::unique_ptr<cmTarget,std::default_delete<cmTarget>>const*,std::vector<std::unique_ptr<cmTarget,std::default_delete<cmTarget>>,std::allocator<std::unique_ptr<cmTarget,std::default_delete<cmTarget>>>>>,(anonymous_namespace)::CheckIMPORTED_GLOBAL(cmTarget_const*,cmMakefile*)::__0>
                       (local_30,(__normal_iterator<const_std::unique_ptr<cmTarget,_std::default_delete<cmTarget>_>_*,_std::vector<std::unique_ptr<cmTarget,_std::default_delete<cmTarget>_>,_std::allocator<std::unique_ptr<cmTarget,_std::default_delete<cmTarget>_>_>_>_>
                                  )local_38,(anon_class_8_1_6ca262cf_for__M_pred)local_40);
  local_48._M_current =
       (unique_ptr<cmTarget,_std::default_delete<cmTarget>_> *)
       std::
       vector<std::unique_ptr<cmTarget,_std::default_delete<cmTarget>_>,_std::allocator<std::unique_ptr<cmTarget,_std::default_delete<cmTarget>_>_>_>
       ::end((vector<std::unique_ptr<cmTarget,_std::default_delete<cmTarget>_>,_std::allocator<std::unique_ptr<cmTarget,_std::default_delete<cmTarget>_>_>_>
              *)it._M_current);
  bVar1 = __gnu_cxx::operator==(&local_28,&local_48);
  if (bVar1) {
    std::__cxx11::ostringstream::ostringstream(local_1c0);
    poVar2 = std::operator<<((ostream *)local_1c0,"Attempt to promote imported target \"");
    psVar3 = cmTarget::GetName_abi_cxx11_((cmTarget *)context_local);
    poVar2 = std::operator<<(poVar2,(string *)psVar3);
    std::operator<<(poVar2,
                    "\" to global scope (by setting IMPORTED_GLOBAL) which is not built in this directory."
                   );
    std::__cxx11::ostringstream::str();
    cmMakefile::IssueMessage(context,FATAL_ERROR,&local_1f0);
    std::__cxx11::string::~string((string *)&local_1f0);
    std::__cxx11::ostringstream::~ostringstream(local_1c0);
  }
  return;
}

Assistant:

void CheckIMPORTED_GLOBAL(const cmTarget* target, cmMakefile* context)
{
  const auto& targets = context->GetOwnedImportedTargets();
  auto it =
    std::find_if(targets.begin(), targets.end(),
                 [&](const std::unique_ptr<cmTarget>& importTarget) -> bool {
                   return target == importTarget.get();
                 });
  if (it == targets.end()) {
    std::ostringstream e;
    e << "Attempt to promote imported target \"" << target->GetName()
      << "\" to global scope (by setting IMPORTED_GLOBAL) "
         "which is not built in this directory.";
    context->IssueMessage(MessageType::FATAL_ERROR, e.str());
  }
}